

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFMove<(moira::Instr)192,(moira::Mode)3,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  bool bVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)3,_4> local_114;
  Fp local_fc;
  int local_f8;
  Ffmt local_f4 [2];
  Dn local_ec [2];
  Ea<(moira::Mode)3,_4> local_e4;
  Fp local_cc;
  int local_c8;
  Ffmt local_c4 [2];
  Ims<1> local_bc;
  Ea<(moira::Mode)3,_4> local_b8;
  Fp local_a0;
  int local_9c;
  Ffmt local_98 [2];
  Fp local_90 [2];
  Ea<(moira::Mode)3,_4> local_88;
  int local_74;
  Ffmt local_70 [2];
  Ffmt local_68 [2];
  Ffmt local_60 [2];
  Fp local_58 [2];
  Fp local_50;
  int local_4c;
  Ffmt local_48 [2];
  Ffmt local_40 [2];
  Ffmt local_38;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  u32 uStack_2c;
  u8 fac;
  u8 dst;
  u8 src;
  u8 cod;
  u8 reg;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  _dst = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  uStack_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 7;
  local_2e = (byte)(uStack_2c >> 0xd) & 7;
  local_2f = (byte)(uStack_2c >> 10) & 7;
  local_30 = (byte)(uStack_2c >> 7) & 7;
  local_31 = (byte)uStack_2c & 0x7f;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar1 = isValidExtFPU(this,FMOVE,PI,ext._2_2_,uStack_2c), bVar1)) {
    if (local_2e == 0) {
      if (local_31 == 0x40) {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(&local_38,2);
        StrWriter::operator<<(pSVar2,local_38);
      }
      else if (local_31 == 0x44) {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_40,2);
        StrWriter::operator<<(pSVar2,local_40[0]);
      }
      else {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_48,2);
        StrWriter::operator<<(pSVar2,local_48[0]);
      }
      local_4c = addr_local[0xe];
      pSVar2 = StrWriter::operator<<((StrWriter *)addr_local,(Tab)local_4c);
      Fp::Fp(&local_50,(uint)local_2f);
      pSVar2 = StrWriter::operator<<(pSVar2,local_50);
      pSVar2 = StrWriter::operator<<(pSVar2);
      Fp::Fp(local_58,(uint)local_30);
      StrWriter::operator<<(pSVar2,local_58[0]);
    }
    else if (local_2e == 2) {
      if (local_31 == 0x40) {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_60,(uint)local_2f);
        StrWriter::operator<<(pSVar2,local_60[0]);
      }
      else if (local_31 == 0x44) {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_68,(uint)local_2f);
        StrWriter::operator<<(pSVar2,local_68[0]);
      }
      else {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_70,(uint)local_2f);
        StrWriter::operator<<(pSVar2,local_70[0]);
      }
      local_74 = addr_local[0xe];
      pSVar2 = StrWriter::operator<<((StrWriter *)addr_local,(Tab)local_74);
      Op<(moira::Mode)3,4>(&local_88,this,(ushort)local_2d,_old);
      pSVar2 = StrWriter::operator<<(pSVar2,&local_88);
      pSVar2 = StrWriter::operator<<(pSVar2);
      Fp::Fp(local_90,(uint)local_30);
      StrWriter::operator<<(pSVar2,local_90[0]);
    }
    else if (local_2e == 3) {
      if (local_2f == 3) {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_98,(uint)local_2f);
        pSVar2 = StrWriter::operator<<(pSVar2,local_98[0]);
        local_9c = addr_local[0xe];
        pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_9c);
        Fp::Fp(&local_a0,(uint)local_30);
        pSVar2 = StrWriter::operator<<(pSVar2,local_a0);
        pSVar2 = StrWriter::operator<<(pSVar2);
        Op<(moira::Mode)3,4>(&local_b8,this,(ushort)local_2d,_old);
        StrWriter::operator<<(pSVar2,&local_b8);
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local,"{");
        Ims<1>::Ims(&local_bc,(int)(char)(local_31 << 1) >> 1);
        pSVar2 = StrWriter::operator<<(pSVar2,local_bc);
        StrWriter::operator<<(pSVar2,"}");
      }
      else if (local_2f == 7) {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_c4,3);
        pSVar2 = StrWriter::operator<<(pSVar2,local_c4[0]);
        local_c8 = addr_local[0xe];
        pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_c8);
        Fp::Fp(&local_cc,(uint)local_30);
        pSVar2 = StrWriter::operator<<(pSVar2,local_cc);
        pSVar2 = StrWriter::operator<<(pSVar2);
        Op<(moira::Mode)3,4>(&local_e4,this,(ushort)local_2d,_old);
        StrWriter::operator<<(pSVar2,&local_e4);
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Dn::Dn(local_ec,(int)(uint)local_31 >> 4);
        StrWriter::operator<<(pSVar2,local_ec[0]);
      }
      else {
        pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_f4,(uint)local_2f);
        pSVar2 = StrWriter::operator<<(pSVar2,local_f4[0]);
        local_f8 = addr_local[0xe];
        pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_f8);
        Fp::Fp(&local_fc,(uint)local_30);
        pSVar2 = StrWriter::operator<<(pSVar2,local_fc);
        pSVar2 = StrWriter::operator<<(pSVar2);
        Op<(moira::Mode)3,4>(&local_114,this,(ushort)local_2d,_old);
        StrWriter::operator<<(pSVar2,&local_114);
      }
    }
  }
  else {
    *_old = _dst;
    dasmIllegal<(moira::Instr)192,(moira::Mode)3,0>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmFMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);
    auto fac = _________xxxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b000:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{2};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{2};
            else str << Ins<I>{} << Ffmt{2};

            str << str.tab << Fp(src) << Sep{} << Fp(dst);
            break;

        case 0b010:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{src};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{src};
            else str << Ins<I>{} << Ffmt{src};

            if (M == Mode::IM) {

                u64 val;

                switch (src) {

                    case 0: // Long-Word Integer
                        val = dasmIncRead<Long>(addr);
                        str << str.tab << Ims<Long>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    case 1: // Single precision

                        val = dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 2: // Double precision
                    case 3: // Packed-Decimal Real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr); // Why???
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 5: // Double-precision real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 6: // Byte Integer
                        val = dasmIncRead<Word>(addr);
                        str << str.tab << Ims<Byte>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    default:
                        str << str.tab << Op<M, Word>(reg, addr) << Sep{} << Fp(dst);
                }
            } else {
                str << str.tab << Op<M, Long>(reg, addr) << Sep{} << Fp(dst);
            }
            break;

        case 0b011:

            switch (src) {

                case 0b011:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp(dst) << Sep{} << Op<M, Long>(reg, addr);
                    str << "{" << Ims<Byte>(i8(fac << 1) >> 1) << "}";
                    break;

                case 0b111:

                    str << Ins<I>{} << Ffmt{3} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    str << Sep{} << Dn(fac >> 4);
                    break;

                default:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}